

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::randomize(Board *this,int player_number)

{
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> __first;
  bool bVar1;
  size_type sVar2;
  mapped_type *ppvVar3;
  pointer this_00;
  int iVar4;
  int local_8c;
  vector<Card,_std::allocator<Card>_> deck;
  Hand hand;
  Card card;
  _Vector_base<Card,_std::allocator<Card>_> local_48;
  
  deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar4 = 1;
  do {
    while( true ) {
      if (iVar4 == 5) break;
      if (iVar4 != player_number) {
        card.m_suit = iVar4;
        ppvVar3 = std::
                  map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                  ::operator[](&this->m_player_hands,&card.m_suit);
        std::vector<Card,_std::allocator<Card>_>::vector
                  ((vector<Card,_std::allocator<Card>_> *)&hand,*ppvVar3);
        card.m_suit = iVar4;
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
        ::erase((_Rb_tree<int,_std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                 *)this,&card.m_suit);
        __first._M_current._4_4_ =
             hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
             _M_start._4_4_;
        __first._M_current._0_4_ =
             (int)hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::vector<Card,std::allocator<Card>>::
        insert<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,void>
                  ((vector<Card,std::allocator<Card>> *)&deck,
                   (const_iterator)
                   deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                   super__Vector_impl_data._M_finish,__first,
                   (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)
                   hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base
                  ((_Vector_base<Card,_std::allocator<Card>_> *)&hand);
      }
      iVar4 = iVar4 + 1;
    }
    std::vector<Card,_std::allocator<Card>_>::vector
              ((vector<Card,_std::allocator<Card>_> *)&local_48,&deck);
    shuffle_cards((vector<Card,_std::allocator<Card>_> *)&hand,
                  (vector<Card,_std::allocator<Card>_> *)&local_48);
    std::vector<Card,_std::allocator<Card>_>::_M_move_assign
              (&deck,(pair<int,_std::vector<Card,_std::allocator<Card>_>_*> *)&hand);
    std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base
              ((_Vector_base<Card,_std::allocator<Card>_> *)&hand);
    std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_48);
    iVar4 = 1;
    if (this->m_current_trick != (Trick *)0x0) {
      iVar4 = this->m_player_to_move;
    }
    while (deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
           _M_finish !=
           deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      if (iVar4 != player_number) {
        hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ =
             Card::get_suit(deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                            super__Vector_impl_data._M_finish + -1);
        local_8c = Card::get_rank(deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                                  super__Vector_impl_data._M_finish + -1);
        Card::Card(&card,(int *)&hand,&local_8c);
        deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_finish = deck.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar4;
        sVar2 = std::
                map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                ::count(&this->m_player_hands,(key_type *)&hand);
        if (sVar2 == 1) {
          hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = iVar4;
          ppvVar3 = std::
                    map<int,_std::vector<Card,_std::allocator<Card>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Card,_std::allocator<Card>_>_*>_>_>
                    ::operator[](&this->m_player_hands,(key_type *)&hand);
          std::vector<Card,_std::allocator<Card>_>::push_back(*ppvVar3,&card);
        }
        else {
          this_00 = (pointer)operator_new(0x18);
          this_00->m_suit = 0;
          this_00->m_rank = 0;
          this_00[1].m_suit = 0;
          this_00[1].m_rank = 0;
          this_00[2].m_suit = 0;
          this_00[2].m_rank = 0;
          std::vector<Card,_std::allocator<Card>_>::push_back
                    ((vector<Card,_std::allocator<Card>_> *)this_00,&card);
          hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = iVar4;
          hand.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
          _M_finish = this_00;
          std::
          _Rb_tree<int,std::pair<int_const,std::vector<Card,std::allocator<Card>>*>,std::_Select1st<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
          ::_M_emplace_unique<std::pair<int,std::vector<Card,std::allocator<Card>>*>>
                    ((_Rb_tree<int,std::pair<int_const,std::vector<Card,std::allocator<Card>>*>,std::_Select1st<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<Card,std::allocator<Card>>*>>>
                      *)this,(pair<int,_std::vector<Card,_std::allocator<Card>_>_*> *)&hand);
        }
      }
      iVar4 = iVar4 % 4 + 1;
    }
    bVar1 = suited_capabilities_met(this);
    iVar4 = 1;
  } while (!bVar1);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base
            (&deck.super__Vector_base<Card,_std::allocator<Card>_>);
  return;
}

Assistant:

void Board::randomize(int player_number)
{
    std::vector<Card> deck;
    do {
        for (unsigned int i(1); i < 5; ++i) // get all the unknown cards, ie the players hands
        {
            if(i != player_number) {
                Hand hand = *m_player_hands[i];
                m_player_hands.erase(i);
                deck.insert(deck.end(), hand.begin(), hand.end());
            }
        }
        deck = shuffle_cards(deck);

        unsigned int current_player_number = 1; // TODO better nomenclature, conflicts with param
        if(m_current_trick != NULL) {
            // People who've already played in trick will be down cards.
            // Dealing from this player means always have same number of cards after trick
            current_player_number = m_player_to_move;
        }
        while ( deck.size() != 0 )
        {
            if(current_player_number != player_number) {
                // TODO get subset of deck that is equal to cards that player_number could possibly have -> suit caps
                // Shuffle and return random card
                Card card(deck.back().get_suit(), deck.back().get_rank());
                deck.pop_back();

                if (m_player_hands.count(current_player_number) == 1) { // if value exists for key
                    m_player_hands[current_player_number]->push_back(card);
                }
                else{
                    Hand* newHand = new Hand();
                    newHand->push_back(card);
                    m_player_hands.insert(std::pair<int, Hand*>(current_player_number, newHand));
                }
            }
            current_player_number = get_next_player(current_player_number);
        }
    }
    while( suited_capabilities_met() == false );
}